

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O1

int32_t __thiscall
icu_63::number::impl::MutablePatternModifier::getCodePointCount(MutablePatternModifier *this)

{
  UnicodeString *output;
  int32_t iVar1;
  int32_t iVar2;
  UErrorCode status;
  UErrorCode local_2c;
  
  local_2c = U_ZERO_ERROR;
  output = &this->currentAffix;
  PatternStringUtils::patternInfoToStringBuilder
            (this->fPatternInfo,true,this->fSignum,this->fSignDisplay,this->fPlural,
             this->perMilleReplacesPercent,output);
  iVar1 = AffixUtils::unescapedCodePointCount(output,&this->super_SymbolProvider,&local_2c);
  PatternStringUtils::patternInfoToStringBuilder
            (this->fPatternInfo,false,this->fSignum,this->fSignDisplay,this->fPlural,
             this->perMilleReplacesPercent,output);
  iVar2 = AffixUtils::unescapedCodePointCount(output,&this->super_SymbolProvider,&local_2c);
  return iVar2 + iVar1;
}

Assistant:

int32_t MutablePatternModifier::getCodePointCount() const {
    // The unsafe code path performs self-mutation, so we need a const_cast.
    // This method needs to be const because it overrides a const method in the parent class.
    auto nonConstThis = const_cast<MutablePatternModifier*>(this);

    // Render the affixes to get the length
    UErrorCode status = U_ZERO_ERROR; // status fails only with an iilegal argument exception
    nonConstThis->prepareAffix(true);
    int result = AffixUtils::unescapedCodePointCount(currentAffix, *this, status);  // prefix length
    nonConstThis->prepareAffix(false);
    result += AffixUtils::unescapedCodePointCount(currentAffix, *this, status);  // suffix length
    return result;
}